

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

int __thiscall Catch::Session::applyCommandLine(Session *this,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Context *this_00;
  Config *config;
  IStream *pIVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  Args *in_RDI;
  unique_ptr<Catch::ColourImpl> colour;
  unique_ptr<Catch::IStream> errStream;
  InternalParseResult result;
  string *in_stack_fffffffffffffe38;
  Session *in_stack_fffffffffffffe40;
  Config *in_stack_fffffffffffffe48;
  unique_ptr<Catch::Config> *in_stack_fffffffffffffe50;
  Session *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  Args *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  IStream *in_stack_fffffffffffffee0;
  ColourMode in_stack_fffffffffffffeef;
  Column *in_stack_fffffffffffffef8;
  ostream *in_stack_ffffffffffffff00;
  unique_ptr<Catch::ColourImpl> local_f0;
  allocator<char> local_e1;
  string local_e0 [32];
  unique_ptr<Catch::IStream> local_c0 [8];
  BasicResult<Catch::Clara::Detail::ParseState> local_80;
  int local_4;
  
  if (((ulong)in_RDI[9].m_args.
              super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
              super__Vector_impl_data._M_start & 1) == 0) {
    Clara::Args::Args(in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                      (char **)in_stack_fffffffffffffe70);
    Clara::Detail::ParserBase::parse
              ((ParserBase *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),in_RDI);
    Clara::Args::~Args((Args *)0x17e50b);
    bVar1 = Clara::Detail::BasicResult::operator_cast_to_bool((BasicResult *)&local_80);
    if (bVar1) {
      if (((ulong)in_RDI[2].m_args.
                  super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                  super__Vector_impl_data._M_start & 0x100000000000000) != 0) {
        showHelp(in_stack_fffffffffffffe40);
      }
      if (((ulong)in_RDI[2].m_args.
                  super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                  super__Vector_impl_data._M_finish & 0x10000) != 0) {
        libIdentify(in_stack_fffffffffffffe70);
      }
      Detail::unique_ptr<Catch::Config>::reset(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      local_4 = 0;
    }
    else {
      Session::config(in_stack_fffffffffffffe40);
      this_00 = getCurrentMutableContext();
      config = Detail::unique_ptr<Catch::Config>::get
                         ((unique_ptr<Catch::Config> *)&in_RDI[9].m_exeName.m_size);
      Context::setConfig(this_00,&config->super_IConfig);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (allocator<char> *)in_stack_fffffffffffffe70);
      makeStream((string *)in_stack_fffffffffffffef8);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator(&local_e1);
      Detail::unique_ptr<Catch::IStream>::get(local_c0);
      makeColourImpl(in_stack_fffffffffffffeef,in_stack_fffffffffffffee0);
      pIVar3 = Detail::unique_ptr<Catch::IStream>::operator->(local_c0);
      (*pIVar3->_vptr_IStream[2])();
      Detail::unique_ptr<Catch::ColourImpl>::operator->(&local_f0);
      ColourImpl::guardColour
                ((ColourImpl *)in_stack_fffffffffffffe48,
                 (Code)((ulong)in_stack_fffffffffffffe40 >> 0x20));
      poVar4 = Catch::operator<<((ostream *)in_stack_fffffffffffffe40,
                                 (ColourGuard *)in_stack_fffffffffffffe38);
      std::operator<<(poVar4,"\nError(s) in input:\n");
      Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::errorMessage_abi_cxx11_
                (&local_80);
      TextFlow::Column::Column((Column *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      TextFlow::Column::indent((Column *)&stack0xfffffffffffffec0,2);
      poVar4 = TextFlow::operator<<(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      std::operator<<(poVar4,"\n\n");
      TextFlow::Column::~Column((Column *)0x17e6e1);
      ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)in_stack_fffffffffffffe40);
      pIVar3 = Detail::unique_ptr<Catch::IStream>::operator->(local_c0);
      iVar2 = (*pIVar3->_vptr_IStream[2])();
      in_stack_fffffffffffffe40 =
           (Session *)
           std::operator<<((ostream *)CONCAT44(extraout_var,iVar2),"Run with -? for usage\n\n");
      std::ostream::operator<<(in_stack_fffffffffffffe40,std::flush<char,std::char_traits<char>>);
      local_4 = 0xff;
      Detail::unique_ptr<Catch::ColourImpl>::~unique_ptr
                ((unique_ptr<Catch::ColourImpl> *)in_stack_fffffffffffffe40);
      Detail::unique_ptr<Catch::IStream>::~unique_ptr
                ((unique_ptr<Catch::IStream> *)in_stack_fffffffffffffe40);
    }
    Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::~BasicResult
              ((BasicResult<Catch::Clara::Detail::ParseState> *)in_stack_fffffffffffffe40);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Session::applyCommandLine( int argc, char const * const * argv ) {
        if( m_startupExceptions )
            return 1;

        auto result = m_cli.parse( Clara::Args( argc, argv ) );

        if( !result ) {
            config();
            getCurrentMutableContext().setConfig(m_config.get());
            auto errStream = makeStream( "%stderr" );
            auto colour = makeColourImpl( ColourMode::PlatformDefault, errStream.get() );

            errStream->stream()
                << colour->guardColour( Colour::Red )
                << "\nError(s) in input:\n"
                << TextFlow::Column( result.errorMessage() ).indent( 2 )
                << "\n\n";
            errStream->stream() << "Run with -? for usage\n\n" << std::flush;
            return MaxExitCode;
        }

        if( m_configData.showHelp )
            showHelp();
        if( m_configData.libIdentify )
            libIdentify();

        m_config.reset();
        return 0;
    }